

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O1

Token __thiscall slang::parsing::ParserBase::peek(ParserBase *this)

{
  Token *pTVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  
  if ((this->window).currentToken.info == (Info *)0x0) {
    if ((this->window).count <= (this->window).currentOffset) {
      Window::addNew(&this->window);
    }
    pTVar1 = (this->window).buffer + (this->window).currentOffset;
    uVar3 = pTVar1->field_0x2;
    NVar4.raw = (pTVar1->numFlags).raw;
    uVar5 = pTVar1->rawLen;
    pIVar2 = pTVar1->info;
    (this->window).currentToken.kind = pTVar1->kind;
    (this->window).currentToken.field_0x2 = uVar3;
    (this->window).currentToken.numFlags = (NumericTokenFlags)NVar4.raw;
    (this->window).currentToken.rawLen = uVar5;
    (this->window).currentToken.info = pIVar2;
  }
  return (this->window).currentToken;
}

Assistant:

Token ParserBase::peek() {
    if (!window.currentToken) {
        if (window.currentOffset >= window.count)
            window.addNew();
        window.currentToken = window.buffer[window.currentOffset];
    }
    SLANG_ASSERT(window.currentToken);
    return window.currentToken;
}